

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

void __thiscall imrt::Station::generateIntensity(Station *this)

{
  int iVar1;
  pair<int,_int> pVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  clearIntensity(this);
  if (0 < this->max_apertures) {
    lVar3 = 0;
    do {
      iVar1 = Collimator::getXdim(this->collimator);
      if (0 < iVar1) {
        lVar4 = 0;
        do {
          pVar2 = Collimator::getActiveRange(this->collimator,(int)lVar4,this->angle);
          if (-1 < pVar2.first) {
            iVar1 = *(int *)(*(long *)&(this->A).
                                       super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar4 * 8);
            lVar5 = (long)iVar1;
            if ((-1 < lVar5) &&
               (iVar1 <= *(int *)(*(long *)&(this->A).
                                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data + 4 + lVar4 * 8))) {
              iVar1 = iVar1 + -1;
              do {
                change_intensity(this,(int)lVar4,(int)lVar5,
                                 (this->I).p[lVar4][lVar5] +
                                 (this->intensity).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar3],
                                 (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  *)0x0);
                lVar5 = lVar5 + 1;
                iVar1 = iVar1 + 1;
              } while (iVar1 < *(int *)(*(long *)&(this->A).
                                                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                  ._M_impl.super__Vector_impl_data + 4 + lVar4 * 8))
              ;
            }
          }
          lVar4 = lVar4 + 1;
          iVar1 = Collimator::getXdim(this->collimator);
        } while (lVar4 < iVar1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->max_apertures);
  }
  return;
}

Assistant:

void Station::generateIntensity(){
    pair <int,int>aux;
    clearIntensity();
    //printIntensity();
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        aux = collimator.getActiveRange(i,angle);
        if (aux.first<0 || A[a][i].first<0) continue;
        //for (int j=aux.first; j<=aux.second; j++) {
        for (int j=A[a][i].first; j<=A[a][i].second; j++) {
          //if (j>=A[a][i].first && j<=A[a][i].second){
            //cout << "a:" <<a << " i:" << i << " j:" <<j << " to add:" <<  intensity[a] << " on:" << I(i,j) <<  endl;
            change_intensity(i, j, I(i,j)+intensity[a]);
          //}
        }
      }
    }
  }